

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

uint dxil_spv::get_geometry_shader_stream_index(MDNode *node)

{
  bool bVar1;
  uint uVar2;
  MetadataKind MVar3;
  MDOperand *pMVar4;
  MDNode *this;
  uint uVar5;
  uint index;
  
  uVar2 = LLVMBC::MDNode::getNumOperands(node);
  if ((10 < uVar2) && (pMVar4 = LLVMBC::MDNode::getOperand(node,10), pMVar4->kind != None)) {
    this = (MDNode *)LLVMBC::MDNode::getOperand(node,10);
    MVar3 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this);
    bVar1 = false;
    uVar2 = 0;
    if (MVar3 == Node) {
      uVar2 = LLVMBC::MDNode::getNumOperands(this);
      bVar1 = true;
      if (1 < uVar2) {
        uVar5 = uVar2 >> 1;
        index = 1;
        do {
          uVar2 = get_constant_metadata<unsigned_int>(this,index - 1);
          if (uVar2 == 0) {
            uVar2 = get_constant_metadata<unsigned_int>(this,index);
            bVar1 = false;
            break;
          }
          index = index + 2;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
    if (!bVar1) {
      return uVar2;
    }
  }
  return 0;
}

Assistant:

static unsigned get_geometry_shader_stream_index(const llvm::MDNode *node)
{
	if (node->getNumOperands() >= 11 && node->getOperand(10))
	{
		auto *attr = llvm::dyn_cast<llvm::MDNode>(node->getOperand(10));
		if (!attr)
			return 0;

		unsigned num_pairs = attr->getNumOperands() / 2;
		for (unsigned i = 0; i < num_pairs; i++)
		{
			if (static_cast<DXIL::GSStageOutTags>(get_constant_metadata(attr, 2 * i + 0)) == DXIL::GSStageOutTags::Stream)
				return get_constant_metadata(attr, 2 * i + 1);
		}
	}
	return 0;
}